

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O1

string * fs_stem_abi_cxx11_(string_view path)

{
  path *ppVar1;
  path *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 auVar3 [16];
  string_type local_b8;
  path local_98;
  path local_70;
  path local_48;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_98,&local_20,auto_format);
  if (local_98._M_pathname._M_string_length != 0) {
    ppVar1 = &local_98;
    if ((~local_98._M_cmpts & 3) == 0) {
LAB_001145be:
      std::filesystem::__cxx11::path::path(&local_70,ppVar1);
      goto LAB_001145d7;
    }
    if (((local_98._32_8_ & 3) == 0) &&
       (local_98._M_pathname._M_dataplus._M_p[local_98._M_pathname._M_string_length - 1] != '/')) {
      if ((local_98._32_8_ & 3) == 0) {
        ppVar1 = (path *)std::filesystem::__cxx11::path::_List::end();
      }
      else {
        ppVar1 = (path *)0x0;
      }
      ppVar2 = (path *)&ppVar1[-2]._M_cmpts;
      if ((local_98._32_8_ & 3) != 0) {
        ppVar2 = ppVar1;
      }
      ppVar1 = &local_98;
      if ((local_98._32_8_ & 3) == 0) {
        ppVar1 = ppVar2;
      }
      if ((~*(uint *)&ppVar1->_M_cmpts & 3) == 0) {
        ppVar1 = &local_98;
        if ((local_98._32_8_ & 3) == 0) {
          ppVar1 = ppVar2;
        }
        goto LAB_001145be;
      }
    }
  }
  std::filesystem::__cxx11::path::path(&local_70);
LAB_001145d7:
  auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar3._8_8_ == 0 || auVar3._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_48);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b8,auVar3._0_8_);
    std::filesystem::__cxx11::path::path(&local_48,&local_b8,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (in_RDI,&local_48,(allocator<char> *)&local_b8);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_98);
  return in_RDI;
}

Assistant:

std::string fs_stem(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().stem().generic_string();
#else
  std::string r = fs_file_name(path);
  // handle special case a/..
  if (r == "..")
    return r;

  // find last dot
  std::string::size_type i = r.find_last_of('.');

  return (i != std::string::npos && i != 0)
    ? r.substr(0, i)
    : r;
#endif
}